

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.c
# Opt level: O0

void vrna_md_defaults_energy_set(int e)

{
  int e_local;
  
  if ((e < 0) || (3 < e)) {
    vrna_message_warning
              (
              "vrna_md_defaults_energy_set@model.c: Energy Set out of range, must be (0 <= e <= 3). Not changing anything!"
              );
  }
  else {
    defaults.energy_set = e;
    energy_set = e;
    vrna_md_update(&defaults);
  }
  return;
}

Assistant:

PUBLIC void
vrna_md_defaults_energy_set(int e)
{
  if ((e >= 0) && (e <= 3)) {
    defaults.energy_set = e;
#ifndef VRNA_DISABLE_BACKWARD_COMPATIBILITY
    energy_set = e;
#endif
    /* update pair/rtype/alias arrays accordingly */
    vrna_md_update(&defaults);
  } else {
    vrna_message_warning(
      "vrna_md_defaults_energy_set@model.c: Energy Set out of range, must be (0 <= e <= 3). Not changing anything!");
  }
}